

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR DSK_getfilename(LispPTR *args)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  LispPTR LVar7;
  long lVar8;
  ulong uVar9;
  DLword *pDVar10;
  char *pcVar11;
  long lVar12;
  char ver [16];
  char aname [255];
  char name [255];
  char dir [4096];
  char vname [4096];
  char lfname [4096];
  char file [4096];
  char acStack_4238 [272];
  char local_4128 [256];
  char local_4028 [8192];
  char local_2028 [4096];
  char local_1028 [4096];
  
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 == 0) {
    uVar3 = args[3];
    if ((uVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
    }
    Lisp_errno = (int *)(Lisp_world + uVar3);
    uVar3 = *args;
    if ((uVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
    }
    bVar1 = (byte)Lisp_world[(ulong)uVar3 + 3];
    uVar9 = (ulong)bVar1;
    if (bVar1 == 0x44) {
      uVar9 = (long)*(int *)(Lisp_world + (ulong)uVar3 + 4) * 2;
      lVar8 = 5;
    }
    else if (bVar1 == 0x43) {
      uVar9 = (ulong)*(int *)(Lisp_world + (ulong)uVar3 + 4);
      lVar8 = 3;
    }
    else {
      error("LispStringLength: Not a character array.\n");
      lVar8 = 5;
    }
    if (lVar8 + uVar9 < 0x1001) {
      uVar3 = *args;
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
      }
      iVar5 = *(int *)(Lisp_world + (ulong)uVar3 + 4);
      iVar6 = 0x1000;
      if (iVar5 < 0x1000) {
        iVar6 = iVar5;
      }
      lVar8 = (long)iVar6;
      if ((char)Lisp_world[(ulong)uVar3 + 3] == 'D') {
        if (iVar5 == 0) {
          pcVar11 = local_2028;
        }
        else {
          lVar8 = lVar8 + (ulong)(lVar8 == 0);
          pDVar10 = Lisp_world +
                    (ulong)Lisp_world[(ulong)uVar3 + 2] +
                    (ulong)(*(uint *)(Lisp_world + uVar3) & 0xfffffff);
          pcVar11 = local_2028;
          do {
            *pcVar11 = *(char *)((ulong)pDVar10 ^ 2);
            pcVar11 = pcVar11 + 1;
            pDVar10 = pDVar10 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        *pcVar11 = '\0';
      }
      else if ((char)Lisp_world[(ulong)uVar3 + 3] == 'C') {
        if (iVar5 != 0) {
          uVar4 = *(uint *)(Lisp_world + uVar3);
          uVar2 = Lisp_world[(ulong)uVar3 + 2];
          lVar12 = 0;
          do {
            local_2028[lVar12] =
                 *(char *)((long)Lisp_world + lVar12 + (ulong)uVar2 + (ulong)(uVar4 & 0xfffffff) * 2
                          ^ 3);
            lVar12 = lVar12 + 1;
          } while (lVar8 + (ulong)(lVar8 == 0) != lVar12);
        }
        local_2028[lVar8] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      iVar5 = unixpathname(local_2028,local_1028,1,0);
      if ((iVar5 != 0) &&
         (iVar5 = unpack_filename(local_1028,local_4028,local_4128,acStack_4238,1), iVar5 != 0)) {
        LVar7 = args[1];
        true_name(local_4028);
        LVar7 = (*(code *)(&DAT_00144364 + *(int *)(&DAT_00144364 + (ulong)(LVar7 - 0xe0000) * 4)))
                          ();
        return LVar7;
      }
    }
    else {
      *Lisp_errno = 200;
    }
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR DSK_getfilename(LispPTR *args)
{
  char *base;
  size_t len;
  int rval;
  int dirp;
  int fatp;
  char lfname[MAXPATHLEN];
  char aname[MAXNAMLEN];
  char vname[MAXPATHLEN];
  char file[MAXPATHLEN];
  char dir[MAXPATHLEN];
  char name[MAXNAMLEN];
  char ver[VERSIONLEN];
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], len, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  len = fatp ? len + 4 + 1 : len + 2 + 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_drive(lfname, drive);
#endif

/*
 * Convert a Lisp file name to UNIX one.  This is a DSK device method.
 * Thus we have to convert a version field too.  Third argument for
 * unixpathname specifies it.
 */
#ifdef DOS
  if (unixpathname(lfname, file, 1, 0, drive, &extlen, rawname) == 0) return (NIL);
#else
  if (unixpathname(lfname, file, 1, 0) == 0) return (NIL);
#endif

  if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);

  switch (args[1]) {
    case RECOG_OLD:
      /*
       * "Old" file means the "newest existing" file.  Thus, we have to
       * check dir is an existing directory or not.  The search has to
       * be done in case insensitive manner.  true_name does this work.
       */

      if (true_name(dir) != -1) {
        /* No such directory. */
        return (NIL);
      }
      /*
       * At this point, true_name has converted dir to the "true" name
       * of the directory.
       */
      if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        /*
         * Recognizing a file on DSK device needs the version information.
         * We gather version information in a version array first.
         */
        if (get_version_array(dir, name) == 0) return (NIL);

        ConcNameAndVersion(name, ver, aname);
        if (get_old(dir, VA.files, aname, vname) == 0) return (NIL);

        if ((rval = true_name(aname)) == 0) return (NIL);
        if (rval == -1) {
          /*
           * The specified file is a directory file.
           */
          strcpy(vname, aname);
          dirp = 1;
        } else {
#ifdef DOS
          strcpy(vname, aname);
#endif
          dirp = 0;
        }
      }

      break;

    case RECOG_OLDEST:
      /*
       * "Oldest" file means the "oldest existing" file.  Thus, we have to
       * check dir is an existing directory or not.
       */
      if (true_name(dir) != -1) {
        /* No such directory. */
        return (NIL);
      }
      if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        if (get_version_array(dir, name) == 0) return (NIL);

        ConcNameAndVersion(name, ver, aname);
        if (get_oldest(dir, VA.files, aname, vname) == 0) return (NIL);

        if ((rval = true_name(aname)) == 0) return (NIL);
        if (rval == -1) {
          /*
           * The specified file is a directory file.
           */
          strcpy(vname, aname);
          dirp = 1;
        } else {
#ifdef DOS
          strcpy(vname, aname);
#endif
          dirp = 0;
        }
      }
      break;

    case RECOG_NEW:
      /*
       * "New" file means the "not existing" file.  Thus it is not
       * necessary that dir is an existing directory.  If dir is not
       * an existing directory, we returns the specified file name
       * as if, the subsequent OPENFILE will find the truth.
       */
      if (true_name(dir) != -1) {
        strcpy(vname, file);
        dirp = 0;
      } else if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        ConcDirAndName(dir, name, aname);
        if ((rval = true_name(aname)) == -1) {
          strcpy(vname, aname);
          dirp = 1;
        } else {
          /*
           * Here, dir is an existing directory.  We have to perform
           * "new" recognition with the version information.
           */
          if (get_version_array(dir, name) == 0) return (NIL);

          ConcNameAndVersion(name, ver, aname);
          if (get_new(dir, VA.files, aname, vname) == 0) return (NIL);
          dirp = 0;
        }
      }
      break;

    case RECOG_OLD_NEW:
      /*
       * "Old/new" file means the "newest existing" or "not existing" file.
       * Thus, if dir is not an existing directory, we can return the
       * specified file name.  If it is an existing one, we have to
       * try "old" recognition on the directory first.  If the recognition
       * fails, we try "new" recognition.
       */
      if (true_name(dir) != -1) {
        strcpy(vname, file);
        dirp = 0;
      } else {
        ConcDirAndName(dir, name, aname);
        if ((rval = true_name(aname)) == -1) {
          strcpy(vname, aname);
          dirp = 1;
        } else {
          if (get_version_array(dir, name) == 0) return (NIL);

          ConcNameAndVersion(name, ver, aname);
          if (get_old_new(dir, VA.files, aname, vname) == 0) return (NIL);
          dirp = 0;
        }
      }
      break;

    case RECOG_NON:
      /*
       * "Non" recognition is used to recognize a sysout file.  The sysout
       * file is dealt with specially, it does not have any version, even
       * if it is on {DSK} device.  Only we have to do here is to make
       * sure the path to reach to the specified file is an existing
       * directories.  The file name itself is recognized as if.
       */
      if (true_name(dir) != -1) return (NIL);
      ConcDirAndName(dir, name, vname);
      strcpy(aname, vname);
      if (true_name(aname) == -1) {
        strcpy(vname, aname);
        dirp = 1;
      } else {
        dirp = 0;
      }
      if (lisppathname(vname, lfname, dirp, 0) == 0) return (NIL);
      STRING_BASE(args[2], base);
      len = strlen(lfname);

#ifndef BYTESWAP
      strncpy(base, lfname, len + 1);
#else
      StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

      return (GetPosSmallp(len));
  }

  /*
   * DSK device does not recognize a directory file as a file.  Thus we should
   * return NIL when the recognized file is a directory.
   */
  if (dirp) return (NIL);

/*
 * Now, vname holds the "versioned" full name of the recognized file in UNIX
 * format.  We have to convert it back to Lisp format.  The version field
 * have to be converted.  The fourth argument for lisppathname specifies it.
 */
#ifdef DOS
  /* For DOS, have to assure we use the name asked for, not the */
  /* faked-up oversion-0 name, so reported names match. */
  {
    char dver[VERSIONLEN];
    separate_version(vname, dver, 0);
    ConcDirAndName(dir, name, aname);
    ConcNameAndVersion(aname, dver, vname);
  }
#endif /* DOS */

  if (lisppathname(vname, lfname, dirp, (dirp ? 0 : 1)) == 0) return (NIL);

  STRING_BASE(args[2], base);
  len = strlen(lfname);

#ifndef BYTESWAP
  strncpy(base, lfname, len + 1);
#else
  StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

  return (GetPosSmallp(len));
}